

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int decode_new_session_ticket
              (uint32_t *lifetime,uint32_t *age_add,ptls_iovec_t *ticket,
              uint32_t *max_early_data_size,uint8_t *src,uint8_t *end)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ushort *puVar7;
  byte bVar8;
  ushort *puVar9;
  ushort *end_00;
  ushort *local_38;
  
  local_38 = (ushort *)src;
  iVar3 = decode32(lifetime,(uint8_t **)&local_38,end);
  if (((iVar3 == 0) && (iVar3 = decode32(age_add,(uint8_t **)&local_38,end), iVar3 == 0)) &&
     (iVar3 = 0x32, 1 < (ulong)((long)end - (long)local_38))) {
    uVar4 = (ulong)(ushort)(*local_38 << 8 | *local_38 >> 8);
    puVar7 = local_38 + 1;
    if (uVar4 - 1 < (ulong)((long)end - (long)puVar7)) {
      lVar5 = (long)local_38 + uVar4 + 2;
      ticket->base = (uint8_t *)puVar7;
      ticket->len = lVar5 - (long)puVar7;
      *max_early_data_size = 0;
      if (1 < (ulong)((long)end - lVar5)) {
        uVar1 = *(ushort *)((long)local_38 + uVar4 + 2);
        uVar6 = (ulong)(ushort)(uVar1 << 8 | uVar1 >> 8);
        local_38 = (ushort *)((long)local_38 + uVar4 + 4);
        if (uVar6 <= (ulong)((long)end - (long)local_38)) {
          puVar7 = (ushort *)(uVar6 + (long)local_38);
          bVar8 = 0;
          while( true ) {
            if (local_38 == puVar7) {
              if (puVar7 != (ushort *)end) {
                return 0x32;
              }
              return 0;
            }
            if ((long)puVar7 - (long)local_38 < 2) {
              return 0x32;
            }
            uVar1 = *local_38;
            uVar2 = uVar1 << 8 | uVar1 >> 8;
            if (uVar2 < 8) {
              if ((bVar8 >> (uVar2 & 0x1f) & 1) != 0) {
                return 0x2f;
              }
              bVar8 = (byte)(1 << ((byte)(uVar1 >> 8) & 0x1f)) & 7 | bVar8;
            }
            if ((ulong)((long)puVar7 - (long)(local_38 + 1)) < 2) break;
            uVar4 = (ulong)(ushort)(local_38[1] << 8 | local_38[1] >> 8);
            puVar9 = local_38 + 2;
            if ((ulong)((long)puVar7 - (long)puVar9) < uVar4) {
              return 0x32;
            }
            end_00 = (ushort *)((long)puVar9 + uVar4);
            local_38 = end_00;
            if ((uVar2 == 0x2e) &&
               (local_38 = puVar9,
               iVar3 = decode32(max_early_data_size,(uint8_t **)&local_38,(uint8_t *)end_00),
               iVar3 != 0)) {
              return iVar3;
            }
            if (local_38 != end_00) {
              return 0x32;
            }
          }
          return 0x32;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int decode_new_session_ticket(uint32_t *lifetime, uint32_t *age_add, ptls_iovec_t *ticket, uint32_t *max_early_data_size,
                                     const uint8_t *src, const uint8_t *end)
{
    uint16_t exttype;
    int ret;

    if ((ret = decode32(lifetime, &src, end)) != 0)
        goto Exit;
    if ((ret = decode32(age_add, &src, end)) != 0)
        goto Exit;
    decode_open_block(src, end, 2, {
        if (src == end) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        *ticket = ptls_iovec_init(src, end - src);
        src = end;
    });

    *max_early_data_size = 0;
    decode_extensions(src, end, &exttype, {
        switch (exttype) {
        case PTLS_EXTENSION_TYPE_TICKET_EARLY_DATA_INFO:
            if ((ret = decode32(max_early_data_size, &src, end)) != 0)
                goto Exit;
            break;
        default:
            src = end;
            break;
        }
    });

    ret = 0;
Exit:
    return ret;
}